

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

App * __thiscall CLI::App::get_option_group(App *this,string *group_name)

{
  pointer psVar1;
  App *pAVar2;
  size_t __n;
  pointer pcVar3;
  int iVar4;
  OptionNotFound *this_00;
  App_p *app;
  pointer psVar5;
  string local_48;
  
  psVar5 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar5 == psVar1) {
      this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      pcVar3 = (group_name->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar3,pcVar3 + group_name->_M_string_length);
      OptionNotFound::OptionNotFound(this_00,&local_48);
      __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
    }
    pAVar2 = (psVar5->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (((pAVar2->name_)._M_string_length == 0) &&
       (__n = (pAVar2->group_)._M_string_length, __n == group_name->_M_string_length)) {
      if (__n == 0) {
        return pAVar2;
      }
      iVar4 = bcmp((pAVar2->group_)._M_dataplus._M_p,(group_name->_M_dataplus)._M_p,__n);
      if (iVar4 == 0) {
        return pAVar2;
      }
    }
    psVar5 = psVar5 + 1;
  } while( true );
}

Assistant:

CLI11_NODISCARD CLI11_INLINE CLI::App *App::get_option_group(std::string group_name) const {
    for(const App_p &app : subcommands_) {
        if(app->name_.empty() && app->group_ == group_name) {
            return app.get();
        }
    }
    throw OptionNotFound(group_name);
}